

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoAssembler.cpp
# Opt level: O0

AssemblerReturnValues __thiscall
NanoAssembler::assembleToMemory
          (NanoAssembler *this,string *inputFile,uchar **bytecodeBuffer,uint *size)

{
  __node_base_ptr *pp_Var1;
  bool bVar2;
  uchar *puVar3;
  reference pAVar4;
  undefined1 local_168 [8];
  AssemberInstruction inst_1;
  iterator __end3;
  iterator __begin3;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *__range3;
  undefined1 local_108 [4];
  uint index;
  AssemberInstruction inst;
  iterator __end2;
  iterator __begin2;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *__range2;
  string local_a0;
  undefined1 local_80 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  labelMap;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> lines;
  uint *size_local;
  uchar **bytecodeBuffer_local;
  string *inputFile_local;
  NanoAssembler *this_local;
  
  std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::vector
            ((vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
             &labelMap._M_h._M_single_bucket);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)local_80);
  std::__cxx11::string::string((string *)&local_a0,(string *)inputFile);
  bVar2 = readLines(this,&local_a0,
                    (vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
                    &labelMap._M_h._M_single_bucket,
                    (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = assemble(this,(vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
                          &labelMap._M_h._M_single_bucket,
                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)local_80);
    if (bVar2) {
      *size = 0;
      pp_Var1 = &labelMap._M_h._M_single_bucket;
      __end2 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::begin
                         ((vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
                          pp_Var1);
      inst._56_8_ = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::end
                              ((vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
                               pp_Var1);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<AssemberInstruction_*,_std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>_>
                                    *)&inst.assembled);
        if (!bVar2) break;
        pAVar4 = __gnu_cxx::
                 __normal_iterator<AssemberInstruction_*,_std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>_>
                 ::operator*(&__end2);
        AssemberInstruction::AssemberInstruction((AssemberInstruction *)local_108,pAVar4);
        *size = inst._40_4_ + *size;
        AssemberInstruction::~AssemberInstruction((AssemberInstruction *)local_108);
        __gnu_cxx::
        __normal_iterator<AssemberInstruction_*,_std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>_>
        ::operator++(&__end2);
      }
      puVar3 = (uchar *)operator_new__((ulong)*size);
      *bytecodeBuffer = puVar3;
      if (*bytecodeBuffer == (uchar *)0x0) {
        this_local._4_4_ = MemoryAllocationError;
      }
      else {
        __range3._4_4_ = 0;
        pp_Var1 = &labelMap._M_h._M_single_bucket;
        __end3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::begin
                           ((vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
                            pp_Var1);
        inst_1._56_8_ =
             std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::end
                       ((vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)pp_Var1
                       );
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<AssemberInstruction_*,_std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>_>
                                      *)&inst_1.assembled);
          if (!bVar2) break;
          pAVar4 = __gnu_cxx::
                   __normal_iterator<AssemberInstruction_*,_std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>_>
                   ::operator*(&__end3);
          AssemberInstruction::AssemberInstruction((AssemberInstruction *)local_168,pAVar4);
          memcpy(*bytecodeBuffer + __range3._4_4_,(void *)((long)&inst_1.line.field_2 + 8),
                 (ulong)(uint)inst_1._40_4_);
          __range3._4_4_ = inst_1._40_4_ + __range3._4_4_;
          AssemberInstruction::~AssemberInstruction((AssemberInstruction *)local_168);
          __gnu_cxx::
          __normal_iterator<AssemberInstruction_*,_std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>_>
          ::operator++(&__end3);
        }
        this_local._4_4_ = Success;
      }
    }
    else {
      this_local._4_4_ = AssemblerError;
    }
  }
  else {
    this_local._4_4_ = IOError;
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)local_80);
  std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::~vector
            ((vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
             &labelMap._M_h._M_single_bucket);
  return this_local._4_4_;
}

Assistant:

AssemblerReturnValues NanoAssembler::assembleToMemory(std::string inputFile, unsigned char*& bytecodeBuffer, unsigned int& size) {
	std::vector<AssemberInstruction> lines;
	std::unordered_map<std::string, size_t> labelMap;
	// Load assembler file from disk
	if (!readLines(inputFile, lines, labelMap)) {
		return AssemblerReturnValues::IOError;
	}
	// Compile to bytecode
	if (assemble(lines, labelMap)) {
		size = 0;
		// Calculate the resulting bytecode size
		for (AssemberInstruction inst : lines) {
			size += inst.length;
		}
		// Allocate buffer to store the bytecode
		bytecodeBuffer = new unsigned char[size];
		if (bytecodeBuffer) {
			unsigned int index = 0;
			// Copy the bytecode to output buffer
			for (AssemberInstruction inst : lines) {
				memcpy(bytecodeBuffer + index, inst.bytecode, inst.length);
				index += inst.length;
			}
			return AssemblerReturnValues::Success;
		}
		return AssemblerReturnValues::MemoryAllocationError;
	}
	return AssemblerReturnValues::AssemblerError;
}